

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O0

void __thiscall
llama_sbatch::add_seq_to_ubatch
          (llama_sbatch *this,llama_ubatch *ubatch,llama_sbatch_seq *seq,size_t length)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  reference pvVar7;
  size_type sVar8;
  ulong in_RCX;
  int *in_RDX;
  byte *in_RSI;
  long *in_RDI;
  bool bVar9;
  int8_t is_last;
  size_t id_1;
  size_t i_7;
  size_t i_6;
  int8_t is_output;
  size_t id;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  value_type_conflict4 *in_stack_ffffffffffffff08;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff10;
  ulong uVar10;
  value_type_conflict4 *in_stack_ffffffffffffff18;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff20;
  value_type vVar11;
  ulong local_80;
  ulong local_70;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  
  if (in_RDI[0xc] == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-batch.cpp"
               ,0x27,"GGML_ASSERT(%s) failed","batch != nullptr");
  }
  if (*(ulong *)(in_RDX + 6) < in_RCX) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-batch.cpp"
               ,0x28,"GGML_ASSERT(%s) failed","length <= seq.length");
  }
  if (((*in_RDX != 0) && (*(int *)(in_RSI + 0xc) != 0)) &&
     (in_RCX != (ulong)*(uint *)(in_RSI + 4) / (ulong)*(uint *)(in_RSI + 0xc))) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-batch.cpp"
               ,0x2b,"GGML_ASSERT(%s) failed",
               "seq.n_seq_id == 0 || ubatch.n_seqs == 0 || length == (size_t) ubatch.n_tokens / ubatch.n_seqs"
              );
  }
  if ((*in_RDX != 0) != (bool)(*in_RSI & 1)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-batch.cpp"
               ,0x2c,"GGML_ASSERT(%s) failed","(seq.n_seq_id != 0) == ubatch.equal_seqs");
  }
  if (*(long *)(in_RDI[0xc] + 8) == 0) {
    in_RSI[0x10] = 0;
    in_RSI[0x11] = 0;
    in_RSI[0x12] = 0;
    in_RSI[0x13] = 0;
    in_RSI[0x14] = 0;
    in_RSI[0x15] = 0;
    in_RSI[0x16] = 0;
    in_RSI[0x17] = 0;
  }
  else if ((*in_RSI & 1) == 0) {
    *(long *)(in_RSI + 0x10) = *(long *)(in_RDI[0xc] + 8) + *(long *)(in_RDX + 4) * 4;
  }
  else {
    for (local_28 = 0; local_28 < in_RCX; local_28 = local_28 + 1) {
      lVar3 = *(long *)(in_RDI[0xc] + 8);
      pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)(in_RDI + 3),
                          *(long *)(in_RDX + 4) + local_28);
      *(undefined4 *)(*(long *)(in_RSI + 0x10) + (*(uint *)(in_RSI + 4) + local_28) * 4) =
           *(undefined4 *)(lVar3 + *pvVar7 * 4);
    }
  }
  if (*(long *)(in_RDI[0xc] + 0x10) == 0) {
    in_RSI[0x18] = 0;
    in_RSI[0x19] = 0;
    in_RSI[0x1a] = 0;
    in_RSI[0x1b] = 0;
    in_RSI[0x1c] = 0;
    in_RSI[0x1d] = 0;
    in_RSI[0x1e] = 0;
    in_RSI[0x1f] = 0;
  }
  else if ((*in_RSI & 1) == 0) {
    *(long *)(in_RSI + 0x18) = *(long *)(in_RDI[0xc] + 0x10) + in_RDI[1] * *(long *)(in_RDX + 4) * 4
    ;
  }
  else {
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      lVar3 = *(long *)(in_RSI + 0x18);
      lVar4 = in_RDI[1];
      uVar2 = *(uint *)(in_RSI + 4);
      lVar5 = *(long *)(in_RDI[0xc] + 0x10);
      lVar6 = in_RDI[1];
      pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)(in_RDI + 3),
                          *(long *)(in_RDX + 4) + local_30);
      memcpy((void *)(lVar3 + lVar4 * (uVar2 + local_30) * 4),(void *)(lVar5 + lVar6 * *pvVar7 * 4),
             in_RDI[1] << 2);
    }
  }
  if ((*in_RSI & 1) == 0) {
    *(long *)(in_RSI + 0x20) = *(long *)(in_RDI[0xc] + 0x18) + *(long *)(in_RDX + 4) * 4;
  }
  else {
    for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
      lVar3 = *(long *)(in_RDI[0xc] + 0x18);
      pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)(in_RDI + 3),
                          *(long *)(in_RDX + 4) + local_38);
      *(undefined4 *)(*(long *)(in_RSI + 0x20) + (*(uint *)(in_RSI + 4) + local_38) * 4) =
           *(undefined4 *)(lVar3 + *pvVar7 * 4);
    }
  }
  if ((*in_RSI & 1) == 0) {
    if (*(long *)(in_RDI[0xc] + 0x20) == 0) {
      for (local_40 = 0; local_40 < in_RCX; local_40 = local_40 + 1) {
        *(undefined4 *)(*(long *)(in_RSI + 0x28) + (*(uint *)(in_RSI + 0xc) + local_40) * 4) = 1;
      }
    }
    else {
      *(long *)(in_RSI + 0x28) = *(long *)(in_RDI[0xc] + 0x20) + *(long *)(in_RDX + 4) * 4;
    }
    if (*(long *)(in_RDI[0xc] + 0x28) != 0) {
      *(long *)(in_RSI + 0x30) = *(long *)(in_RDI[0xc] + 0x28) + *(long *)(in_RDX + 4) * 8;
    }
  }
  else {
    *(int *)(*(long *)(in_RSI + 0x28) + (ulong)*(uint *)(in_RSI + 0xc) * 4) = *in_RDX;
    if (*(long *)(in_RDX + 2) != 0) {
      *(undefined8 *)(*(long *)(in_RSI + 0x30) + (ulong)*(uint *)(in_RSI + 0xc) * 8) =
           *(undefined8 *)(in_RDX + 2);
    }
  }
  if ((*(byte *)(in_RDI + 2) & 1) == 0) {
    if (*(long *)(in_RDI[0xc] + 0x30) == 0) {
      for (local_80 = 0; local_80 < in_RCX; local_80 = local_80 + 1) {
        pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                           ((vector<long,_std::allocator<long>_> *)(in_RDI + 3),
                            *(long *)(in_RDX + 4) + local_80);
        vVar11 = *pvVar7;
        sVar8 = std::vector<long,_std::allocator<long>_>::size
                          ((vector<long,_std::allocator<long>_> *)(in_RDI + 3));
        bVar9 = vVar11 == sVar8 - 1;
        *(bool *)(*(long *)(in_RSI + 0x38) + *(uint *)(in_RSI + 4) + local_80) = bVar9;
        if (bVar9) {
          std::vector<long,_std::allocator<long>_>::push_back
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
      }
    }
    else if ((*in_RSI & 1) == 0) {
      *(long *)(in_RSI + 0x38) = *(long *)(in_RDI[0xc] + 0x30) + *(long *)(in_RDX + 4);
      for (local_70 = 0; local_70 < in_RCX; local_70 = local_70 + 1) {
        if (*(char *)(*(long *)(in_RSI + 0x38) + local_70) != '\0') {
          std::vector<long,_std::allocator<long>_>::push_back
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
      }
    }
    else {
      for (local_50 = 0; local_50 < in_RCX; local_50 = local_50 + 1) {
        pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                           ((vector<long,_std::allocator<long>_> *)(in_RDI + 3),
                            *(long *)(in_RDX + 4) + local_50);
        cVar1 = *(char *)(*(long *)(in_RDI[0xc] + 0x30) + *pvVar7);
        *(char *)(*(long *)(in_RSI + 0x38) + *(uint *)(in_RSI + 4) + local_50) = cVar1;
        if (cVar1 != '\0') {
          std::vector<long,_std::allocator<long>_>::push_back
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
      }
    }
  }
  else {
    for (local_48 = 0; local_48 < in_RCX; local_48 = local_48 + 1) {
      *(undefined1 *)(*(long *)(in_RSI + 0x38) + *(uint *)(in_RSI + 4) + local_48) = 1;
      std::vector<long,_std::allocator<long>_>::operator[]
                ((vector<long,_std::allocator<long>_> *)(in_RDI + 3),
                 *(long *)(in_RDX + 4) + local_48);
      std::vector<long,_std::allocator<long>_>::push_back
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
  }
  if ((*(int *)(in_RSI + 4) == 0) && (*(int *)(in_RSI + 0xc) == 0)) {
    uVar10 = in_RCX;
    if ((*in_RSI & 1) == 0) {
      uVar10 = 1;
    }
    *(int *)(in_RSI + 8) = (int)uVar10;
  }
  *(int *)(in_RSI + 4) = *(int *)(in_RSI + 4) + (int)in_RCX;
  uVar10 = in_RCX;
  if ((*in_RSI & 1) != 0) {
    uVar10 = 1;
  }
  *(int *)(in_RSI + 0xc) = *(int *)(in_RSI + 0xc) + (int)uVar10;
  *(ulong *)(in_RDX + 4) = in_RCX + *(long *)(in_RDX + 4);
  *(ulong *)(in_RDX + 6) = *(long *)(in_RDX + 6) - in_RCX;
  *in_RDI = *in_RDI - in_RCX;
  if (*(int *)(in_RSI + 4) == *(int *)(in_RSI + 8) * *(int *)(in_RSI + 0xc)) {
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-batch.cpp"
             ,0x89,"GGML_ASSERT(%s) failed","ubatch.n_tokens == ubatch.n_seq_tokens * ubatch.n_seqs"
            );
}

Assistant:

void llama_sbatch::add_seq_to_ubatch(llama_ubatch & ubatch, llama_sbatch_seq & seq, size_t length) {
    GGML_ASSERT(batch != nullptr);
    GGML_ASSERT(length <= seq.length);
    // Can only add sequences of equal lengths to a batch,
    // otherwise it isn't clear to which sequence a token belongs
    GGML_ASSERT(seq.n_seq_id == 0 || ubatch.n_seqs == 0 || length == (size_t) ubatch.n_tokens / ubatch.n_seqs);
    GGML_ASSERT((seq.n_seq_id != 0) == ubatch.equal_seqs);
    // NOTE: loops are separated for cache-friendliness
    if (batch->token) {
        if (ubatch.equal_seqs) {
            for (size_t i = 0; i < length; ++i) {
                ubatch.token[ubatch.n_tokens + i] = batch->token[ids[seq.offset + i]];
            }
        } else {
            // simple split
            ubatch.token = batch->token + seq.offset;
        }
    } else {
        ubatch.token = nullptr;
    }
    if (batch->embd) {
        if (ubatch.equal_seqs) {
            for (size_t i = 0; i < length; ++i) {
                memcpy(
                        ubatch.embd + (n_embd * (ubatch.n_tokens + i)),
                        batch->embd + (n_embd * ids[seq.offset + i]),
                        n_embd * sizeof(float)
                      );
            }
        } else {
            // simple split
            ubatch.embd = batch->embd + (n_embd * seq.offset);
        }
    } else {
        ubatch.embd = nullptr;
    }
    if (ubatch.equal_seqs) {
        for (size_t i = 0; i < length; ++i) {
            ubatch.pos[ubatch.n_tokens + i] = batch->pos[ids[seq.offset + i]];
        }
    } else {
        // simple split
        ubatch.pos = batch->pos + seq.offset;
    }
    if (ubatch.equal_seqs) {
        ubatch.n_seq_id[ubatch.n_seqs] = seq.n_seq_id;
        if (seq.seq_id) {
            ubatch.seq_id[ubatch.n_seqs] = seq.seq_id;
        }
    } else {
        // simple split
        if (batch->n_seq_id) {
            ubatch.n_seq_id = batch->n_seq_id + seq.offset;
        } else {
            for (size_t i = 0; i < length; ++i) {
                ubatch.n_seq_id[ubatch.n_seqs + i] = 1;
            }
        }
        if (batch->seq_id) {
            ubatch.seq_id = batch->seq_id + seq.offset;
        }
    }
    if (logits_all) {
        for (size_t i = 0; i < length; ++i) {
            ubatch.output[ubatch.n_tokens + i] = 1;
            out_ids.push_back(ids[seq.offset + i]);
        }
    } else if (batch->logits) {
        if (ubatch.equal_seqs) {
            for (size_t i = 0; i < length; ++i) {
                size_t id = ids[seq.offset + i];
                int8_t is_output = batch->logits[id];
                ubatch.output[ubatch.n_tokens + i] = is_output;
                if (is_output) { out_ids.push_back(id); }
            }
        } else {
            // simple split
            ubatch.output = batch->logits + seq.offset;
            for (size_t i = 0; i < length; ++i) {
                if (ubatch.output[i] != 0) { out_ids.push_back(seq.offset + i); }
            }
        }
    } else {
        // only get last output
        for (size_t i = 0; i < length; ++i) {
            size_t id = ids[seq.offset + i];
            int8_t is_last = id == ids.size() - 1;
            ubatch.output[ubatch.n_tokens + i] = is_last;
            if (is_last) { out_ids.push_back(id); }
        }
    }
    if (ubatch.n_tokens == 0 && ubatch.n_seqs == 0) {
        ubatch.n_seq_tokens = ubatch.equal_seqs ? length : 1;
    }
    ubatch.n_tokens += length;
    ubatch.n_seqs += ubatch.equal_seqs ? 1 : length; // virtual sequences for simple splits
    seq.offset += length;
    seq.length -= length;
    n_tokens -= length;
    GGML_ASSERT(ubatch.n_tokens == ubatch.n_seq_tokens * ubatch.n_seqs);
}